

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void __thiscall kj::Exception::~Exception(Exception *this)

{
  ArrayBuilder<kj::Exception::Detail>::dispose(&(this->details).builder);
  Array<char>::~Array(&(this->remoteTrace).content);
  Own<kj::Exception::Context,_std::nullptr_t>::dispose(&(this->context).ptr);
  Array<char>::~Array(&(this->description).content);
  Array<char>::~Array((Array<char> *)this);
  return;
}

Assistant:

Exception::~Exception() noexcept {}